

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall Timer::Register(Timer *this,TimeEvent *timer)

{
  double dVar1;
  TimeEvent *local_18;
  TimeEvent *timer_local;
  Timer *this_local;
  
  if (timer->lifetime != 0) {
    local_18 = timer;
    timer_local = (TimeEvent *)this;
    dVar1 = GetTime();
    local_18->lasttime = dVar1;
    local_18->manager = this;
    this->changed = true;
    std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::insert
              (&this->timers,&local_18);
  }
  return;
}

Assistant:

void Timer::Register(TimeEvent *timer)
{
	if (timer->lifetime == 0)
	{
		return;
	}

	timer->lasttime = Timer::GetTime();
	timer->manager = this;

	this->changed = true;
	this->timers.insert(timer);
}